

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O2

uint64_t ullog2(uint64_t x)

{
  ulong uVar1;
  
  uVar1 = x >> 1 | x;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 0x10 | uVar1;
  uVar1 = uVar1 >> 0x20 | uVar1;
  return ullog2::magic_table[(~(uVar1 >> 1) & uVar1) * 0x22fdd63cc95386d >> 0x3a];
}

Assistant:

static uint64_t ullog2(uint64_t x)
{
    static const uint64_t debruijn_magic = 0x022fdd63cc95386dULL;

    static const uint64_t magic_table[] = {
        0, 1, 2, 53, 3, 7, 54, 27, 4, 38, 41, 8, 34, 55, 48, 28,
        62, 5, 39, 46, 44, 42, 22, 9, 24, 35, 59, 56, 49, 18, 29, 11,
        63, 52, 6, 26, 37, 40, 33, 47, 61, 45, 43, 21, 23, 58, 17, 10,
        51, 25, 36, 32, 60, 20, 57, 16, 50, 31, 19, 15, 30, 14, 13, 12,
    };

    x |= (x >> 1);
    x |= (x >> 2);
    x |= (x >> 4);
    x |= (x >> 8);
    x |= (x >> 16);
    x |= (x >> 32);
    return (magic_table[((x & ~(x>>1))*debruijn_magic)>>58]);
}